

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRngPErr(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node,int error,char *msg,xmlChar *str1,
               xmlChar *str2)

{
  int iVar1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  void *pvStack_70;
  int res;
  void *data;
  xmlGenericErrorFunc channel;
  xmlStructuredErrorFunc schannel;
  xmlChar *str2_local;
  xmlChar *str1_local;
  char *msg_local;
  int error_local;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  channel = (xmlGenericErrorFunc)0x0;
  data = (void *)0x0;
  pvStack_70 = (void *)0x0;
  if (ctxt != (xmlRelaxNGParserCtxtPtr)0x0) {
    if (ctxt->serror == (xmlStructuredErrorFunc)0x0) {
      data = ctxt->error;
    }
    else {
      channel = (xmlGenericErrorFunc)ctxt->serror;
    }
    pvStack_70 = ctxt->userData;
    ctxt->nbErrors = ctxt->nbErrors + 1;
  }
  if ((data == (void *)0x0) && (channel == (xmlGenericErrorFunc)0x0)) {
    pp_Var2 = __xmlGenericError();
    data = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    pvStack_70 = *ppvVar3;
  }
  iVar1 = xmlRaiseError((xmlStructuredErrorFunc)channel,(xmlGenericErrorFunc)data,pvStack_70,
                        (void *)0x0,node,0x12,error,XML_ERR_ERROR,(char *)0x0,0,(char *)str1,
                        (char *)str2,(char *)0x0,0,0,msg,str1,str2);
  if (iVar1 < 0) {
    xmlRngPErrMemory(ctxt);
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(4,0)
xmlRngPErr(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node, int error,
           const char *msg, const xmlChar * str1, const xmlChar * str2)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;
    int res;

    if (ctxt != NULL) {
        if (ctxt->serror != NULL)
	    schannel = ctxt->serror;
	else
	    channel = ctxt->error;
        data = ctxt->userData;
        ctxt->nbErrors++;
    }